

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_reseed(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  size_t local_1b0;
  size_t seedlen;
  uchar seed [384];
  size_t len_local;
  uchar *additional_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  if ((len < 0x101) && (ctx->entropy_len + len < 0x181)) {
    seed._376_8_ = len;
    memset(&seedlen,0,0x180);
    iVar1 = (*ctx->f_entropy)(ctx->p_entropy,(uchar *)&seedlen,ctx->entropy_len);
    if (iVar1 == 0) {
      local_1b0 = ctx->entropy_len;
      if ((additional != (uchar *)0x0) && (seed._376_8_ != 0)) {
        memcpy(seed + (local_1b0 - 8),additional,seed._376_8_);
        local_1b0 = seed._376_8_ + local_1b0;
      }
      mbedtls_hmac_drbg_update(ctx,(uchar *)&seedlen,local_1b0);
      ctx->reseed_counter = 1;
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = -9;
    }
  }
  else {
    ctx_local._4_4_ = -5;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_reseed( mbedtls_hmac_drbg_context *ctx,
                      const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT];
    size_t seedlen;

    /* III. Check input length */
    if( len > MBEDTLS_HMAC_DRBG_MAX_INPUT ||
        ctx->entropy_len + len > MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT )
    {
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    memset( seed, 0, MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT );

    /* IV. Gather entropy_len bytes of entropy for the seed */
    if( ctx->f_entropy( ctx->p_entropy, seed, ctx->entropy_len ) != 0 )
        return( MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED );

    seedlen = ctx->entropy_len;

    /* 1. Concatenate entropy and additional data if any */
    if( additional != NULL && len != 0 )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /* 2. Update state */
    mbedtls_hmac_drbg_update( ctx, seed, seedlen );

    /* 3. Reset reseed_counter */
    ctx->reseed_counter = 1;

    /* 4. Done */
    return( 0 );
}